

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lemon.c
# Opt level: O2

void LemonAtExit(void)

{
  int iVar1;
  long lVar2;
  
  iVar1 = made_files_count;
  for (lVar2 = 0; lVar2 < iVar1; lVar2 = lVar2 + 1) {
    if (successful_exit == 0) {
      remove(made_files[lVar2]);
      iVar1 = made_files_count;
    }
  }
  free(made_files);
  made_files_count = 0;
  made_files = (char **)0x0;
  return;
}

Assistant:

static void LemonAtExit(void)
{
    /* if we failed, delete (most) files we made, to unconfuse build tools. */
    int i;
    for (i = 0; i < made_files_count; i++) {
        if (!successful_exit) {
            remove(made_files[i]);
        }
    }
    free(made_files);
    made_files_count = 0;
    made_files = NULL;
}